

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O2

string * __thiscall
iDynTree::ExternalMesh::getFileLocationOnLocalFileSystem_abi_cxx11_
          (string *__return_storage_ptr__,ExternalMesh *this)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  __type _Var5;
  size_t i_1;
  istream *piVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  string *output;
  string *this_00;
  size_t i;
  __node_base *p_Var10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string individualPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  envListShare;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  envListPrefix;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pathList;
  stringstream env_var_string;
  string local_198 [360];
  
  pathList._M_h._M_buckets = &pathList._M_h._M_single_bucket;
  pathList._M_h._M_bucket_count = 1;
  pathList._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  pathList._M_h._M_element_count = 0;
  pathList._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  pathList._M_h._M_rehash_policy._M_next_resize = 0;
  pathList._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pbVar1 = (this->packageDirs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->packageDirs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&env_var_string,"GAZEBO_MODEL_PATH",(allocator<char> *)&individualPath);
    std::__cxx11::string::string<std::allocator<char>>
              (local_198,"ROS_PACKAGE_PATH",(allocator<char> *)&local_258);
    __l._M_len = 2;
    __l._M_array = (iterator)&env_var_string;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&envListShare,__l,(allocator_type *)&envListPrefix);
    lVar8 = 0x20;
    do {
      std::__cxx11::string::~string((string *)(&env_var_string + lVar8));
      lVar8 = lVar8 + -0x20;
    } while (lVar8 != -0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&env_var_string,"AMENT_PREFIX_PATH",(allocator<char> *)&individualPath);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&env_var_string;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&envListPrefix,__l_00,(allocator_type *)&local_258);
    std::__cxx11::string::~string((string *)&env_var_string);
    for (uVar7 = 0;
        uVar7 < (ulong)((long)envListShare.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)envListShare.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
      pcVar9 = getenv(envListShare.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p);
      if (pcVar9 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&individualPath,pcVar9,(allocator<char> *)&local_258);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&env_var_string,(string *)&individualPath,_S_out|_S_in);
        std::__cxx11::string::~string((string *)&individualPath);
        individualPath._M_dataplus._M_p = (pointer)&individualPath.field_2;
        individualPath._M_string_length = 0;
        individualPath.field_2._M_local_buf[0] = '\0';
        while( true ) {
          piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&env_var_string,(string *)&individualPath,':');
          if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
          std::__detail::
          _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)&pathList,&individualPath);
        }
        std::__cxx11::string::~string((string *)&individualPath);
        std::__cxx11::stringstream::~stringstream((stringstream *)&env_var_string);
      }
    }
    for (uVar7 = 0;
        uVar7 < (ulong)((long)envListPrefix.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)envListPrefix.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
      pcVar9 = getenv(envListPrefix.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p);
      if (pcVar9 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&individualPath,pcVar9,(allocator<char> *)&local_258);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&env_var_string,(string *)&individualPath,_S_out|_S_in);
        std::__cxx11::string::~string((string *)&individualPath);
        individualPath._M_dataplus._M_p = (pointer)&individualPath.field_2;
        individualPath._M_string_length = 0;
        individualPath.field_2._M_local_buf[0] = '\0';
        while( true ) {
          piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&env_var_string,(string *)&individualPath,':');
          if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
          std::operator+(&local_258,&individualPath,"/share");
          std::__detail::
          _Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
          ::insert((_Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                    *)&pathList,&local_258);
          std::__cxx11::string::~string((string *)&local_258);
        }
        std::__cxx11::string::~string((string *)&individualPath);
        std::__cxx11::stringstream::~stringstream((stringstream *)&env_var_string);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&envListPrefix);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&envListShare);
  }
  else {
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _Hashtable<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&env_var_string,pbVar1,pbVar2,0,&individualPath,&local_258,&envListShare);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::operator=(&pathList._M_h,
                (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&env_var_string);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&env_var_string);
  }
  pcVar9 = "package:/";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"package:/",(allocator<char> *)&envListShare);
  this_00 = &this->filename;
  bVar4 = getFileLocationOnLocalFileSystem::anon_class_2_2_096a8fa6::
          anon_class_1_0_00000001_for_isFileExisting::operator()
                    ((anon_class_1_0_00000001_for_isFileExisting *)this_00,(string *)pcVar9);
  if (!bVar4) {
    std::__cxx11::string::substr((ulong)&env_var_string,(ulong)this_00);
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &env_var_string,&local_258);
    std::__cxx11::string::~string((string *)&env_var_string);
    if (_Var5) {
      std::__cxx11::string::string((string *)&env_var_string,(string *)this_00);
      std::__cxx11::string::erase((ulong)&env_var_string,0);
      p_Var10 = &pathList._M_h._M_before_begin;
      while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
        std::operator+(&individualPath,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var10 + 1),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &env_var_string);
        filename = &individualPath;
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&individualPath);
        for (uVar7 = 0; uVar7 < __return_storage_ptr__->_M_string_length; uVar7 = uVar7 + 1) {
          pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
          if (pcVar3[uVar7] == '\\') {
            pcVar3[uVar7] = '/';
          }
        }
        std::__cxx11::string::~string((string *)&individualPath);
        bVar4 = getFileLocationOnLocalFileSystem::anon_class_2_2_096a8fa6::
                anon_class_1_0_00000001_for_isFileExisting::operator()
                          ((anon_class_1_0_00000001_for_isFileExisting *)__return_storage_ptr__,
                           filename);
        if (bVar4) {
          std::__cxx11::string::~string((string *)&env_var_string);
          goto LAB_001baa78;
        }
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      std::__cxx11::string::~string((string *)&env_var_string);
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this_00);
LAB_001baa78:
  std::__cxx11::string::~string((string *)&local_258);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&pathList._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::string ExternalMesh::getFileLocationOnLocalFileSystem() const
    {
        bool isWindows = false;
    #ifdef _WIN32
        isWindows = true;
    #endif

        std::unordered_set<std::string> pathList;

        // if the user provides the packageDirs we do not check inside the dirs listed in the
        // environment variables
        if (!this->packageDirs.empty())
        {
            pathList = std::unordered_set<std::string>(this->packageDirs.begin(),
                                                       this->packageDirs.end());
        } else {
            // List of variables that contain <prefix>/share paths
            std::vector<std::string> envListShare = {"GAZEBO_MODEL_PATH", "ROS_PACKAGE_PATH"};
            // List of variables that contains <prefix> paths (to which /share needs to be added)
            std::vector<std::string> envListPrefix = {"AMENT_PREFIX_PATH"};

            for (size_t i = 0; i < envListShare.size(); ++i)
            {
                const char * env_var_value = std::getenv(envListShare[i].c_str());

                if (env_var_value)
                {
                    std::stringstream env_var_string(env_var_value);

                    std::string individualPath;

                    while(std::getline(env_var_string, individualPath, isWindows ? ';' : ':'))
                    {
                        pathList.insert(individualPath);
                    }
                }
            }

            for (size_t i = 0; i < envListPrefix.size(); ++i)
            {
                const char * env_var_value = std::getenv(envListPrefix[i].c_str());

                if (env_var_value)
                {
                    std::stringstream env_var_string(env_var_value);

                    std::string individualPath;

                    while(std::getline(env_var_string, individualPath, isWindows ? ';' : ':'))
                    {
                        pathList.insert(individualPath + "/share");
                    }
                }
            }
        }
        auto cleanPathSeparator = [isWindows](const std::string& filename)->std::string
        {
            std::string output = filename;
            char pathSeparator = isWindows ? '\\' : '/';
            char wrongPathSeparator = isWindows ? '/' : '\\';

            for (size_t i = 0; i < output.size(); ++i)
            {
                if (output[i] == wrongPathSeparator)
                {
                    output[i] = pathSeparator;
                }
            }

            return output;

        };

        auto isFileExisting = [](const std::string& filename)->bool
        {
            if (FILE *file = fopen(filename.c_str(), "r")) {
                fclose(file);
                return true;
            } else {
                return false;
            }
        };

        auto getFilePath = [isFileExisting, cleanPathSeparator](const std::string& filename, const std::string& prefixToRemove, const std::unordered_set<std::string>& paths)
        {
            if(isFileExisting(filename))
            {
                return filename;
            }

            if (filename.substr(0, prefixToRemove.size()) == prefixToRemove)
            {
                std::string filename_noprefix = filename;
                filename_noprefix.erase(0, prefixToRemove.size());
                for (const std::string& path : paths)
                {
                    const std::string testPath  = cleanPathSeparator(path + filename_noprefix);
                    if (isFileExisting(testPath))
                    {
                        return testPath;
                    }
                }

            }

            return filename; //By default return the input;
        };

        return getFilePath(filename, "package:/", pathList);
    }